

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

QDebug operator<<(QDebug d,QMetaType m)

{
  DataPointer *pDVar1;
  storage_type *in_RCX;
  long in_RDX;
  long lVar2;
  QString *this;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)m.d_ptr);
  pQVar3 = *(QTextStream **)m.d_ptr;
  *(undefined1 *)&pQVar3[3]._vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QMetaType(";
  QString::fromUtf8(&local_40,(QString *)0xa,ba);
  QTextStream::operator<<(pQVar3,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&(*(QTextStream **)m.d_ptr)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)m.d_ptr,' ');
  }
  if (in_RDX == 0) {
    pQVar3 = *(QTextStream **)m.d_ptr;
  }
  else {
    lVar2 = *(long *)(in_RDX + 0x18);
    pQVar3 = *(QTextStream **)m.d_ptr;
    if (lVar2 != 0) {
      this = (QString *)0xffffffffffffffff;
      do {
        pDVar1 = &this->d;
        this = (QString *)((long)&(this->d).d + 1);
      } while (*(char *)((long)&pDVar1->d + lVar2 + 1) != '\0');
      goto LAB_00290551;
    }
  }
  lVar2 = 0;
  this = (QString *)0x0;
LAB_00290551:
  ba_00.m_data = in_RCX;
  ba_00.m_size = lVar2;
  QString::fromUtf8(&local_40,this,ba_00);
  QTextStream::operator<<(pQVar3,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar3 = *(QTextStream **)m.d_ptr;
  if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)m.d_ptr;
  }
  ba_01.m_data = in_RCX;
  ba_01.m_size = (qsizetype)")";
  QString::fromUtf8(&local_40,(QString *)0x1,ba_01);
  QTextStream::operator<<(pQVar3,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar3 = *(QTextStream **)m.d_ptr;
  if (*(char *)&pQVar3[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)m.d_ptr;
  }
  ((d.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar3;
  *(int *)&pQVar3[2].d_ptr._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       *(int *)&pQVar3[2].d_ptr._M_t.
                super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
                _M_t.
                super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QDebug)d.stream;
}

Assistant:

QDebug operator<<(QDebug d, QMetaType m)
{
    const QDebugStateSaver saver(d);
    return d.nospace() << "QMetaType(" << m.name() << ")";
}